

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O0

void __thiscall
jbcoin::template_field_error::template_field_error(template_field_error *this,SField *f)

{
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  SField *local_18;
  SField *f_local;
  template_field_error *this_local;
  
  local_18 = f;
  f_local = (SField *)this;
  SField::getName_abi_cxx11_(&local_78,f);
  std::operator+(&local_58,"template field error \'",&local_78);
  std::operator+(&local_38,&local_58,"\'");
  std::logic_error::logic_error(&this->super_logic_error,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  *(undefined ***)this = &PTR__template_field_error_00518ff0;
  return;
}

Assistant:

explicit
    template_field_error (SField const& f)
        : logic_error(
            "template field error '" + f.getName() + "'")
    {
    }